

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O1

void Extra_TruthSwapAdjacentVars2(uint *pIn,uint *pOut,int nVars,int Start)

{
  int iVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint *puVar10;
  int iVar11;
  uint *puVar12;
  uint *puVar13;
  uint *puVar14;
  uint *puVar15;
  
  uVar8 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar8 = 1;
  }
  if (nVars + -1 <= Start) {
    __assert_fail("Start < nVars - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilTruth.c"
                  ,0xb0,
                  "void Extra_TruthSwapAdjacentVars2(unsigned int *, unsigned int *, int, int)");
  }
  switch(Start) {
  case 0:
    if (0 < (int)uVar8) {
      uVar3 = 0;
      do {
        uVar9 = pIn[uVar3];
        pOut[uVar3] = uVar9 >> 1 & 0x22222222 | (uVar9 & 0x99999999) + (uVar9 & 0x22222222) * 2;
        uVar3 = uVar3 + 1;
      } while (uVar8 != uVar3);
    }
    break;
  case 1:
    if (0 < (int)uVar8) {
      uVar3 = 0;
      do {
        uVar9 = pIn[uVar3];
        pOut[uVar3] = uVar9 >> 2 & 0xc0c0c0c | (uVar9 & 0xc3c3c3c3) + (uVar9 & 0xc0c0c0c) * 4;
        uVar3 = uVar3 + 1;
      } while (uVar8 != uVar3);
    }
    break;
  case 2:
    if (0 < (int)uVar8) {
      uVar3 = 0;
      do {
        uVar9 = pIn[uVar3];
        pOut[uVar3] = uVar9 >> 4 & 0xf000f0 | (uVar9 & 0xf000f0) << 4 | uVar9 & 0xf00ff00f;
        uVar3 = uVar3 + 1;
      } while (uVar8 != uVar3);
    }
    break;
  case 3:
    if (0 < (int)uVar8) {
      uVar3 = 0;
      do {
        uVar9 = pIn[uVar3];
        pOut[uVar3] = uVar9 >> 8 & 0xff00 | (uVar9 & 0xff00) << 8 | uVar9 & 0xff0000ff;
        uVar3 = uVar3 + 1;
      } while (uVar8 != uVar3);
    }
    break;
  case 4:
    if (0 < (int)uVar8) {
      uVar3 = 0;
      do {
        pOut[uVar3] = pIn[uVar3 + 1] << 0x10 | (uint)(ushort)pIn[uVar3];
        pOut[uVar3 + 1] =
             CONCAT22(*(undefined2 *)((long)pIn + uVar3 * 4 + 6),
                      *(undefined2 *)((long)pIn + uVar3 * 4 + 2));
        uVar3 = uVar3 + 2;
      } while (uVar3 < uVar8);
    }
    break;
  default:
    if (0 < (int)uVar8) {
      iVar1 = Start + -5;
      bVar2 = (byte)iVar1;
      uVar9 = 1 << (bVar2 & 0x1f);
      iVar11 = 2 << (bVar2 & 0x1f);
      iVar5 = 3 << (bVar2 & 0x1f);
      iVar4 = 4 << (bVar2 & 0x1f);
      uVar3 = 1;
      if (1 < (int)uVar9) {
        uVar3 = (ulong)uVar9;
      }
      puVar10 = pOut + (int)uVar9;
      puVar12 = pIn + iVar11;
      puVar6 = pOut + iVar11;
      puVar14 = pIn + (int)uVar9;
      puVar15 = pIn + iVar5;
      puVar13 = pOut + iVar5;
      iVar5 = 0;
      do {
        if (iVar1 != 0x1f) {
          uVar7 = 0;
          do {
            pOut[uVar7] = pIn[uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar3 != uVar7);
          uVar7 = 0;
          do {
            puVar10[uVar7] = puVar12[uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar3 != uVar7);
          uVar7 = 0;
          do {
            puVar6[uVar7] = puVar14[uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar3 != uVar7);
          if (iVar1 != 0x1f) {
            uVar7 = 0;
            do {
              puVar13[uVar7] = puVar15[uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar3 != uVar7);
          }
        }
        iVar5 = iVar5 + iVar4;
        pOut = pOut + iVar4;
        pIn = pIn + iVar4;
        puVar10 = puVar10 + iVar4;
        puVar12 = puVar12 + iVar4;
        puVar6 = puVar6 + iVar4;
        puVar14 = puVar14 + iVar4;
        puVar15 = puVar15 + iVar4;
        puVar13 = puVar13 + iVar4;
      } while (iVar5 < (int)uVar8);
    }
  }
  return;
}

Assistant:

void Extra_TruthSwapAdjacentVars2( unsigned * pIn, unsigned * pOut, int nVars, int Start )
{
    int nWords = (nVars <= 5)? 1 : (1 << (nVars-5));
    int i, k, Step;

    assert( Start < nVars - 1 );
    switch ( Start )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0x99999999) | ((pIn[i] & 0x22222222) << 1) | ((pIn[i] & 0x44444444) >> 1);
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0xC3C3C3C3) | ((pIn[i] & 0x0C0C0C0C) << 2) | ((pIn[i] & 0x30303030) >> 2);
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0xF00FF00F) | ((pIn[i] & 0x00F000F0) << 4) | ((pIn[i] & 0x0F000F00) >> 4);
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0xFF0000FF) | ((pIn[i] & 0x0000FF00) << 8) | ((pIn[i] & 0x00FF0000) >> 8);
        return;
    case 4:
        for ( i = 0; i < nWords; i += 2 )
        {
            pOut[i]   = (pIn[i]   & 0x0000FFFF) | ((pIn[i+1] & 0x0000FFFF) << 16);
            pOut[i+1] = (pIn[i+1] & 0xFFFF0000) | ((pIn[i]   & 0xFFFF0000) >> 16);
        }
        return;
    default:
        Step = (1 << (Start - 5));
        for ( k = 0; k < nWords; k += 4*Step )
        {
            for ( i = 0; i < Step; i++ )
                pOut[i] = pIn[i];
            for ( i = 0; i < Step; i++ )
                pOut[Step+i] = pIn[2*Step+i];
            for ( i = 0; i < Step; i++ )
                pOut[2*Step+i] = pIn[Step+i];
            for ( i = 0; i < Step; i++ )
                pOut[3*Step+i] = pIn[3*Step+i];
            pIn  += 4*Step;
            pOut += 4*Step;
        }
        return;
    }
}